

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O2

void rngInit(void)

{
  bool_t bVar1;
  
  bVar1 = mtMtxCreate(_mtx);
  if (bVar1 != 0) {
    bVar1 = utilOnExit(rngDestroy);
    if (bVar1 == 0) {
      mtMtxClose(_mtx);
      return;
    }
    _inited = 1;
  }
  return;
}

Assistant:

static void rngInit()
{
	ASSERT(!_inited);
	// создать мьютекс
	if (!mtMtxCreate(_mtx))
		return;
	// зарегистрировать деструктор
	if (!utilOnExit(rngDestroy))
	{
		mtMtxClose(_mtx);
		return;
	}
	_inited = TRUE;
}